

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

mz_bool mz_zip_writer_add_file
                  (mz_zip_archive *pZip,char *pArchive_name,char *pSrc_filename,void *pComment,
                  mz_uint16 comment_size,mz_uint level_and_flags)

{
  mz_uint mVar1;
  mz_uint16 method;
  mz_uint8 *ptr;
  mz_bool mVar2;
  tdefl_status tVar3;
  char *pcVar4;
  size_t sVar5;
  void *pvVar6;
  char cVar7;
  size_t sVar8;
  size_t sVar9;
  void *pvVar10;
  uint uVar11;
  ulong uVar12;
  mz_uint64 mVar13;
  mz_uint64 mVar14;
  ushort uVar15;
  uint uVar16;
  void *pvVar17;
  mz_uint16 dos_date_00;
  mz_uint64 in_stack_ffffffffffffef68;
  mz_ulong crc;
  mz_uint16 dos_date;
  mz_uint16 dos_time;
  FILE *local_1080;
  ulong local_1078;
  mz_uint8 *local_1070;
  void *local_1068;
  tdefl_compressor *local_1060;
  size_t local_1058;
  mz_uint64 local_1050;
  ulong local_1048;
  void *local_1040;
  char buf [4096];
  
  dos_time = 0;
  dos_date = 0;
  uVar16 = 6;
  if (-1 < (int)level_and_flags) {
    uVar16 = level_and_flags;
  }
  if (pZip->m_pState == (mz_zip_internal_state *)0x0) {
    return 0;
  }
  if (pArchive_name == (char *)0x0) {
    return 0;
  }
  if (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING) {
    return 0;
  }
  if ((uVar16 >> 10 & 1) != 0) {
    return 0;
  }
  if (pComment == (void *)0x0 && comment_size != 0) {
    return 0;
  }
  if (10 < (uVar16 & 0xf)) {
    return 0;
  }
  cVar7 = *pArchive_name;
  if (cVar7 == '/') {
    return 0;
  }
  mVar13 = pZip->m_archive_size;
  pcVar4 = pArchive_name + 1;
  while (cVar7 != '\0') {
    if (cVar7 == ':') {
      return 0;
    }
    if (cVar7 == '\\') {
      return 0;
    }
    cVar7 = *pcVar4;
    pcVar4 = pcVar4 + 1;
  }
  local_1040 = pComment;
  local_1058 = strlen(pArchive_name);
  if (0xffff < local_1058) {
    return 0;
  }
  if (pZip->m_total_files == 0xffff) {
    return 0;
  }
  mVar1 = pZip->m_file_offset_alignment;
  local_1078 = (ulong)(mVar1 - ((uint)mVar13 & mVar1 - 1) & mVar1 - 1);
  if (mVar1 == 0) {
    local_1078 = 0;
  }
  local_1050 = mVar13 + local_1078;
  if (local_1058 + comment_size + local_1050 + 0x4c >> 0x20 != 0) {
    return 0;
  }
  mVar2 = (anonymous_namespace)::miniz::mz_zip_get_file_modified_time
                    (pSrc_filename,&dos_time,&dos_date);
  if (mVar2 == 0) {
    return 0;
  }
  local_1080 = fopen64(pSrc_filename,"rb");
  if (local_1080 == (FILE *)0x0) {
    return 0;
  }
  fseeko64(local_1080,0,2);
  local_1068 = (void *)ftello64(local_1080);
  fseeko64(local_1080,0,0);
  if ((ulong)local_1068 >> 0x20 != 0) {
    fclose(local_1080);
    return 0;
  }
  uVar16 = uVar16 & 0xf;
  if (local_1068 < (void *)0x4) {
    uVar16 = 0;
  }
  uVar12 = local_1078 + 0x1e;
  sVar8 = 0x1000;
  if ((uint)uVar12 < 0x1000) {
    sVar8 = uVar12 & 0xffffffff;
  }
  local_1048 = (ulong)comment_size;
  memset(buf,0,sVar8);
  mVar14 = mVar13;
  local_1078 = uVar12;
  do {
    sVar8 = local_1058;
    uVar11 = (uint)uVar12;
    if (uVar11 == 0) {
      if ((pZip->m_file_offset_alignment != 0) &&
         (((uint)local_1050 & pZip->m_file_offset_alignment - 1) != 0)) {
        __assert_fail("(local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/stanford-cs248[P]shading/CS248/include/CS248/tinyexr.h"
                      ,0x1864,
                      "mz_bool (anonymous namespace)::miniz::mz_zip_writer_add_file(mz_zip_archive *, const char *, const char *, const void *, mz_uint16, mz_uint)"
                     );
      }
      mVar14 = local_1078 + mVar14;
      sVar9 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar14,pArchive_name,local_1058);
      if (sVar9 == sVar8) {
        local_1078 = mVar14 + sVar8;
        if (local_1068 == (void *)0x0) {
          pvVar17 = (void *)0x0;
          uVar15 = 0;
          crc = 0;
          goto LAB_0017450d;
        }
        local_1070 = (mz_uint8 *)(*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,0x10000);
        if (local_1070 != (mz_uint8 *)0x0) {
          if (uVar16 == 0) {
            crc = 0;
            pvVar17 = local_1068;
            goto LAB_00174483;
          }
          local_1060 = (tdefl_compressor *)(*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,0x4df78);
          if (local_1060 == (tdefl_compressor *)0x0) goto LAB_00174675;
          buf[8] = (undefined1)local_1078;
          buf[9] = local_1078._1_1_;
          buf[10] = local_1078._2_1_;
          buf[0xb] = local_1078._3_1_;
          buf[0xc] = local_1078._4_1_;
          buf[0xd] = local_1078._5_1_;
          buf[0xe] = local_1078._6_1_;
          buf[0xf] = local_1078._7_1_;
          uVar12 = 10;
          if (uVar16 < 10) {
            uVar12 = (ulong)uVar16;
          }
          buf[0x10] = '\0';
          buf[0x11] = '\0';
          buf[0x12] = '\0';
          buf[0x13] = '\0';
          buf[0x14] = '\0';
          buf[0x15] = '\0';
          buf[0x16] = '\0';
          buf[0x17] = '\0';
          buf._0_8_ = pZip;
          tdefl_init(local_1060,(anonymous_namespace)::miniz::mz_zip_writer_add_put_buf_callback,buf
                     ,(uint)(uVar16 < 4) << 0xe |
                      tdefl_write_image_to_png_file_in_memory_ex::s_tdefl_png_num_probes[uVar12]);
          ptr = local_1070;
          crc = 0;
          pvVar17 = local_1068;
          goto LAB_001743d0;
        }
      }
      break;
    }
    sVar9 = 0x1000;
    if (uVar11 < 0x1000) {
      sVar9 = uVar12 & 0xffffffff;
    }
    sVar5 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar13,buf,sVar9);
    mVar13 = mVar13 + sVar9;
    uVar12 = (ulong)(uVar11 - (int)sVar9);
  } while (sVar5 == sVar9);
  goto LAB_00174681;
  while( true ) {
    crc = mz_crc32(crc,local_1070,(size_t)pvVar10);
    local_1078 = uVar12 + (long)pvVar10;
    pvVar17 = (void *)((long)pvVar17 - (long)pvVar10);
    if (pvVar17 == (void *)0x0) break;
LAB_00174483:
    pvVar10 = (void *)0x10000;
    if (pvVar17 < (void *)0x10000) {
      pvVar10 = pvVar17;
    }
    pvVar6 = (void *)fread(local_1070,1,(size_t)pvVar10,local_1080);
    uVar12 = local_1078;
    if ((pvVar6 != pvVar10) ||
       (pvVar6 = (void *)(*pZip->m_pWrite)(pZip->m_pIO_opaque,local_1078,local_1070,(size_t)pvVar10)
       , pvVar6 != pvVar10)) goto LAB_00174675;
  }
  uVar15 = 0;
  pvVar17 = local_1068;
LAB_00174501:
  (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_1070);
LAB_0017450d:
  fclose(local_1080);
  method = dos_date;
  if ((ulong)pvVar17 >> 0x20 != 0) {
    return 0;
  }
  if (local_1078 >> 0x20 != 0) {
    return 0;
  }
  buf[4] = '\x14';
  if (uVar15 == 0) {
    buf[4] = '\0';
  }
  builtin_strncpy(buf,"PK\x03\x04",4);
  buf[5] = '\0';
  buf[6] = '\0';
  buf[7] = '\0';
  buf[10] = (char)dos_time;
  buf._8_2_ = uVar15;
  local_1080 = (FILE *)CONCAT44(local_1080._4_4_,(uint)dos_time);
  buf[0xb] = (char)(dos_time >> 8);
  buf[0xc] = (char)dos_date;
  buf[0xd] = (char)(dos_date >> 8);
  buf[0xe] = (char)crc;
  buf[0xf] = (char)(crc >> 8);
  buf._16_2_ = (undefined2)(crc >> 0x10);
  buf[0x12] = (char)pvVar17;
  buf[0x13] = (char)((ulong)pvVar17 >> 8);
  buf[0x14] = (char)((ulong)pvVar17 >> 0x10);
  buf[0x15] = (char)((ulong)pvVar17 >> 0x18);
  buf[0x16] = (char)local_1068;
  buf[0x17] = (char)((ulong)local_1068 >> 8);
  buf[0x18] = (char)((ulong)local_1068 >> 0x10);
  buf[0x19] = (char)((ulong)local_1068 >> 0x18);
  buf[0x1a] = (char)local_1058;
  buf[0x1b] = (char)(local_1058 >> 8);
  buf[0x1c] = '\0';
  buf[0x1d] = '\0';
  dos_date_00 = 0x45fc;
  sVar9 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,local_1050,buf,0x1e);
  if (sVar9 != 0x1e) {
    return 0;
  }
  mVar2 = (anonymous_namespace)::miniz::mz_zip_writer_add_to_central_dir
                    (pZip,pArchive_name,(mz_uint16)local_1058,local_1040,(mz_uint16)local_1048,
                     local_1068,(mz_uint16)pvVar17,crc,(ulong)uVar15,(uint)local_1080 & 0xffff,
                     method,(mz_uint16)local_1050,0,dos_date_00,in_stack_ffffffffffffef68,
                     (mz_uint32)crc);
  if (mVar2 == 0) {
    return 0;
  }
  pZip->m_total_files = pZip->m_total_files + 1;
  pZip->m_archive_size = local_1078;
  return 1;
  while( true ) {
    crc = mz_crc32(crc,ptr,(size_t)pvVar10);
    pvVar17 = (void *)((long)pvVar17 - (long)pvVar10);
    tVar3 = tdefl_compress_buffer
                      (local_1060,ptr,(size_t)pvVar10,(uint)(pvVar17 == (void *)0x0) << 2);
    if (tVar3 != TDEFL_STATUS_OKAY) break;
LAB_001743d0:
    pvVar10 = (void *)0x10000;
    if (pvVar17 < (void *)0x10000) {
      pvVar10 = pvVar17;
    }
    pvVar6 = (void *)fread(ptr,1,(size_t)pvVar10,local_1080);
    if (pvVar6 != pvVar10) goto LAB_00174669;
  }
  if (tVar3 == TDEFL_STATUS_DONE) {
    (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_1060);
    local_1078._0_1_ = buf[8];
    local_1078._1_1_ = buf[9];
    local_1078._2_1_ = buf[10];
    local_1078._3_1_ = buf[0xb];
    local_1078._4_1_ = buf[0xc];
    local_1078._5_1_ = buf[0xd];
    local_1078._6_1_ = buf[0xe];
    local_1078._7_1_ = buf[0xf];
    uVar15 = 8;
    pvVar17 = (void *)buf._16_8_;
    goto LAB_00174501;
  }
LAB_00174669:
  (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_1060);
LAB_00174675:
  (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_1070);
LAB_00174681:
  fclose(local_1080);
  return 0;
}

Assistant:

mz_bool mz_zip_writer_add_file(mz_zip_archive *pZip, const char *pArchive_name,
                               const char *pSrc_filename, const void *pComment,
                               mz_uint16 comment_size,
                               mz_uint level_and_flags) {
  mz_uint uncomp_crc32 = MZ_CRC32_INIT, level, num_alignment_padding_bytes;
  mz_uint16 method = 0, dos_time = 0, dos_date = 0, ext_attributes = 0;
  mz_uint64 local_dir_header_ofs = pZip->m_archive_size,
            cur_archive_file_ofs = pZip->m_archive_size, uncomp_size = 0,
            comp_size = 0;
  size_t archive_name_size;
  mz_uint8 local_dir_header[MZ_ZIP_LOCAL_DIR_HEADER_SIZE];
  MZ_FILE *pSrc_file = NULL;

  if ((int)level_and_flags < 0)
    level_and_flags = MZ_DEFAULT_LEVEL;
  level = level_and_flags & 0xF;

  if ((!pZip) || (!pZip->m_pState) ||
      (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING) || (!pArchive_name) ||
      ((comment_size) && (!pComment)) || (level > MZ_UBER_COMPRESSION))
    return MZ_FALSE;
  if (level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA)
    return MZ_FALSE;
  if (!mz_zip_writer_validate_archive_name(pArchive_name))
    return MZ_FALSE;

  archive_name_size = strlen(pArchive_name);
  if (archive_name_size > 0xFFFF)
    return MZ_FALSE;

  num_alignment_padding_bytes =
      mz_zip_writer_compute_padding_needed_for_file_alignment(pZip);

  // no zip64 support yet
  if ((pZip->m_total_files == 0xFFFF) ||
      ((pZip->m_archive_size + num_alignment_padding_bytes +
        MZ_ZIP_LOCAL_DIR_HEADER_SIZE + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE +
        comment_size + archive_name_size) > 0xFFFFFFFF))
    return MZ_FALSE;

  if (!mz_zip_get_file_modified_time(pSrc_filename, &dos_time, &dos_date))
    return MZ_FALSE;

  pSrc_file = MZ_FOPEN(pSrc_filename, "rb");
  if (!pSrc_file)
    return MZ_FALSE;
  MZ_FSEEK64(pSrc_file, 0, SEEK_END);
  uncomp_size = MZ_FTELL64(pSrc_file);
  MZ_FSEEK64(pSrc_file, 0, SEEK_SET);

  if (uncomp_size > 0xFFFFFFFF) {
    // No zip64 support yet
    MZ_FCLOSE(pSrc_file);
    return MZ_FALSE;
  }
  if (uncomp_size <= 3)
    level = 0;

  if (!mz_zip_writer_write_zeros(pZip, cur_archive_file_ofs,
                                 num_alignment_padding_bytes +
                                     sizeof(local_dir_header))) {
    MZ_FCLOSE(pSrc_file);
    return MZ_FALSE;
  }
  local_dir_header_ofs += num_alignment_padding_bytes;
  if (pZip->m_file_offset_alignment) {
    MZ_ASSERT((local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) ==
              0);
  }
  cur_archive_file_ofs +=
      num_alignment_padding_bytes + sizeof(local_dir_header);

  MZ_CLEAR_OBJ(local_dir_header);
  if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pArchive_name,
                     archive_name_size) != archive_name_size) {
    MZ_FCLOSE(pSrc_file);
    return MZ_FALSE;
  }
  cur_archive_file_ofs += archive_name_size;

  if (uncomp_size) {
    mz_uint64 uncomp_remaining = uncomp_size;
    void *pRead_buf =
        pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1, MZ_ZIP_MAX_IO_BUF_SIZE);
    if (!pRead_buf) {
      MZ_FCLOSE(pSrc_file);
      return MZ_FALSE;
    }

    if (!level) {
      while (uncomp_remaining) {
        mz_uint n = (mz_uint)MZ_MIN(MZ_ZIP_MAX_IO_BUF_SIZE, uncomp_remaining);
        if ((MZ_FREAD(pRead_buf, 1, n, pSrc_file) != n) ||
            (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pRead_buf,
                            n) != n)) {
          pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
          MZ_FCLOSE(pSrc_file);
          return MZ_FALSE;
        }
        uncomp_crc32 =
            (mz_uint32)mz_crc32(uncomp_crc32, (const mz_uint8 *)pRead_buf, n);
        uncomp_remaining -= n;
        cur_archive_file_ofs += n;
      }
      comp_size = uncomp_size;
    } else {
      mz_bool result = MZ_FALSE;
      mz_zip_writer_add_state state;
      tdefl_compressor *pComp = (tdefl_compressor *)pZip->m_pAlloc(
          pZip->m_pAlloc_opaque, 1, sizeof(tdefl_compressor));
      if (!pComp) {
        pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
        MZ_FCLOSE(pSrc_file);
        return MZ_FALSE;
      }

      state.m_pZip = pZip;
      state.m_cur_archive_file_ofs = cur_archive_file_ofs;
      state.m_comp_size = 0;

      if (tdefl_init(pComp, mz_zip_writer_add_put_buf_callback, &state,
                     tdefl_create_comp_flags_from_zip_params(
                         level, -15, MZ_DEFAULT_STRATEGY)) !=
          TDEFL_STATUS_OKAY) {
        pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
        pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
        MZ_FCLOSE(pSrc_file);
        return MZ_FALSE;
      }

      for (;;) {
        size_t in_buf_size =
            (mz_uint32)MZ_MIN(uncomp_remaining, MZ_ZIP_MAX_IO_BUF_SIZE);
        tdefl_status status;

        if (MZ_FREAD(pRead_buf, 1, in_buf_size, pSrc_file) != in_buf_size)
          break;

        uncomp_crc32 = (mz_uint32)mz_crc32(
            uncomp_crc32, (const mz_uint8 *)pRead_buf, in_buf_size);
        uncomp_remaining -= in_buf_size;

        status = tdefl_compress_buffer(pComp, pRead_buf, in_buf_size,
                                       uncomp_remaining ? TDEFL_NO_FLUSH
                                                        : TDEFL_FINISH);
        if (status == TDEFL_STATUS_DONE) {
          result = MZ_TRUE;
          break;
        } else if (status != TDEFL_STATUS_OKAY)
          break;
      }

      pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);

      if (!result) {
        pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
        MZ_FCLOSE(pSrc_file);
        return MZ_FALSE;
      }

      comp_size = state.m_comp_size;
      cur_archive_file_ofs = state.m_cur_archive_file_ofs;

      method = MZ_DEFLATED;
    }

    pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
  }

  MZ_FCLOSE(pSrc_file);
  pSrc_file = NULL;

  // no zip64 support yet
  if ((comp_size > 0xFFFFFFFF) || (cur_archive_file_ofs > 0xFFFFFFFF))
    return MZ_FALSE;

  if (!mz_zip_writer_create_local_dir_header(
          pZip, local_dir_header, (mz_uint16)archive_name_size, 0, uncomp_size,
          comp_size, uncomp_crc32, method, 0, dos_time, dos_date))
    return MZ_FALSE;

  if (pZip->m_pWrite(pZip->m_pIO_opaque, local_dir_header_ofs, local_dir_header,
                     sizeof(local_dir_header)) != sizeof(local_dir_header))
    return MZ_FALSE;

  if (!mz_zip_writer_add_to_central_dir(
          pZip, pArchive_name, (mz_uint16)archive_name_size, NULL, 0, pComment,
          comment_size, uncomp_size, comp_size, uncomp_crc32, method, 0,
          dos_time, dos_date, local_dir_header_ofs, ext_attributes))
    return MZ_FALSE;

  pZip->m_total_files++;
  pZip->m_archive_size = cur_archive_file_ofs;

  return MZ_TRUE;
}